

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageResizeNN(Image *image,int newWidth,int newHeight)

{
  int iVar1;
  int iVar2;
  Image image_00;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Color *colors;
  void *pvVar7;
  undefined8 in_stack_ffffffffffffffb0;
  int local_40;
  int format;
  int x;
  int y;
  int y2;
  int x2;
  int yRatio;
  int xRatio;
  Color *output;
  Color *pixels;
  int newHeight_local;
  int newWidth_local;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    uVar3 = image->width;
    uVar4 = image->height;
    uVar5 = image->mipmaps;
    uVar6 = image->format;
    image_00.height = uVar6;
    image_00.width = uVar5;
    image_00.data._4_4_ = uVar4;
    image_00.data._0_4_ = uVar3;
    image_00._16_8_ = in_stack_ffffffffffffffb0;
    colors = LoadImageColors(image_00);
    pvVar7 = malloc((long)(newWidth * newHeight) << 2);
    iVar1 = image->width;
    iVar2 = image->height;
    for (format = 0; format < newHeight; format = format + 1) {
      for (local_40 = 0; local_40 < newWidth; local_40 = local_40 + 1) {
        *(Color *)((long)pvVar7 + (long)(format * newWidth + local_40) * 4) =
             colors[(format * ((iVar2 << 0x10) / newHeight + 1) >> 0x10) * image->width +
                    (local_40 * ((iVar1 << 0x10) / newWidth + 1) >> 0x10)];
      }
    }
    iVar1 = image->format;
    free(image->data);
    image->data = pvVar7;
    image->width = newWidth;
    image->height = newHeight;
    image->format = 7;
    ImageFormat(image,iVar1);
    UnloadImageColors(colors);
  }
  return;
}

Assistant:

void ImageResizeNN(Image *image,int newWidth,int newHeight)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);
    Color *output = (Color *)RL_MALLOC(newWidth*newHeight*sizeof(Color));

    // EDIT: added +1 to account for an early rounding problem
    int xRatio = (int)((image->width << 16)/newWidth) + 1;
    int yRatio = (int)((image->height << 16)/newHeight) + 1;

    int x2, y2;
    for (int y = 0; y < newHeight; y++)
    {
        for (int x = 0; x < newWidth; x++)
        {
            x2 = ((x*xRatio) >> 16);
            y2 = ((y*yRatio) >> 16);

            output[(y*newWidth) + x] = pixels[(y2*image->width) + x2] ;
        }
    }

    int format = image->format;

    RL_FREE(image->data);

    image->data = output;
    image->width = newWidth;
    image->height = newHeight;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);  // Reformat 32bit RGBA image to original format

    UnloadImageColors(pixels);
}